

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionCheck.cpp
# Opt level: O0

void ExceptionCheck::SetHandledExceptionType(ExceptionType e)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ExceptionType *pEVar4;
  undefined8 *in_FS_OFFSET;
  ExceptionType e_local;
  
  if (((e & ExceptionType_DisableCheck) != ExceptionType_None) && (e != ExceptionType_DisableCheck))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x38,
                       "((e & ExceptionType_DisableCheck) == 0 || e == ExceptionType_DisableCheck)",
                       "(e & ExceptionType_DisableCheck) == 0 || e == ExceptionType_DisableCheck");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  BVar3 = IsEmpty();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                       ,0x39,"(IsEmpty())","IsEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((e != ExceptionType_None) && (e != ExceptionType_DisableCheck)) {
    BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
    if ((BVar3 != 0) &&
       (((e & ExceptionType_JavascriptException) != ExceptionType_JavascriptException &&
        (e != ExceptionType_HasStackProbe)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/ExceptionCheck.cpp"
                         ,0x40,
                         "(e == ExceptionType_None || e == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || (e & ExceptionType_JavascriptException) == ExceptionType_JavascriptException || e == ExceptionType_HasStackProbe)"
                         ,
                         "e == ExceptionType_None || e == ExceptionType_DisableCheck || !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() || (e & ExceptionType_JavascriptException) == ExceptionType_JavascriptException || e == ExceptionType_HasStackProbe"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  pEVar4 = (ExceptionType *)data();
  *pEVar4 = e;
  return;
}

Assistant:

void ExceptionCheck::SetHandledExceptionType(ExceptionType e)
{
    Assert((e & ExceptionType_DisableCheck) == 0 || e == ExceptionType_DisableCheck);
    Assert(IsEmpty());

    // If script is active, we don't want any scope to try to handle OOM on its own, just let script handle it.
    Assert(e == ExceptionType_None ||
        e == ExceptionType_DisableCheck ||
        !JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext() ||
        (e & ExceptionType_JavascriptException) == ExceptionType_JavascriptException ||
        e == ExceptionType_HasStackProbe);

    data.handledExceptionType = e;
}